

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_blend2.cpp
# Opt level: O1

int str_to_blend_mode(string *str)

{
  int iVar1;
  int iVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)str);
  iVar2 = 0;
  if (iVar1 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)str);
    if (iVar2 == 0) {
      iVar2 = 1;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)str);
      if (iVar2 == 0) {
        iVar2 = 4;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)str);
        if (iVar2 == 0) {
          iVar2 = 5;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)str);
          if (iVar2 == 0) {
            iVar2 = 6;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)str);
            if (iVar2 == 0) {
              iVar2 = 7;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)str);
              if (iVar2 == 0) {
                iVar2 = 2;
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)str);
                if (iVar2 == 0) {
                  iVar2 = 3;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)str);
                  iVar2 = 0;
                  if (iVar1 != 0) {
                    iVar1 = std::__cxx11::string::compare((char *)str);
                    iVar2 = 1;
                    if (iVar1 != 0) {
                      iVar1 = std::__cxx11::string::compare((char *)str);
                      iVar2 = 2;
                      if (iVar1 != 0) {
                        iVar2 = std::__cxx11::string::compare((char *)str);
                        if (iVar2 == 0) {
                          iVar2 = 8;
                        }
                        else {
                          iVar2 = std::__cxx11::string::compare((char *)str);
                          iVar2 = (uint)(iVar2 == 0) * 8 + 1;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int str_to_blend_mode(const std::string & str)
{
   if (str == "ZERO")
      return ALLEGRO_ZERO;
   if (str == "ONE")
      return ALLEGRO_ONE;
   if (str == "SRC_COLOR")
      return ALLEGRO_SRC_COLOR;
   if (str == "DEST_COLOR")
      return ALLEGRO_DEST_COLOR;
   if (str == "INV_SRC_COLOR")
      return ALLEGRO_INVERSE_SRC_COLOR;
   if (str == "INV_DEST_COLOR")
      return ALLEGRO_INVERSE_DEST_COLOR;
   if (str == "ALPHA")
      return ALLEGRO_ALPHA;
   if (str == "INVERSE")
      return ALLEGRO_INVERSE_ALPHA;
   if (str == "ADD")
      return ALLEGRO_ADD;
   if (str == "SRC_MINUS_DEST")
      return ALLEGRO_SRC_MINUS_DEST;
   if (str == "DEST_MINUS_SRC")
      return ALLEGRO_DEST_MINUS_SRC;
   if (str == "CONST_COLOR")
      return ALLEGRO_CONST_COLOR;
   if (str == "INV_CONST_COLOR")
      return ALLEGRO_INVERSE_CONST_COLOR;

   ALLEGRO_ASSERT(false);
   return ALLEGRO_ONE;
}